

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O3

void __thiscall brown::App::App(App *this,Simulator *sim)

{
  char *__s;
  
  this->sim = sim;
  Tile::Tile(&this->dd);
  this->window = (SDL_Window *)0x0;
  this->renderer = (SDL_Renderer *)0x0;
  this->userInit = (_func_void_Simulator_ptr *)0x0;
  this->userLoop = (_func_void_Simulator_ptr *)0x0;
  this->texture = (SDL_Texture *)0x0;
  this->xres = 0x640;
  this->yres = 800;
  this->isBreak = false;
  this->mousx = 0;
  this->mousy = 0;
  this->dmousx = 0;
  this->dmousy = 0;
  this->bstatus = 0;
  sim->app = this;
  __s = (char *)operator_new__(0x100);
  this->keystatus = __s;
  memset(__s,0,0x100);
  return;
}

Assistant:

App::App(Simulator& sim): sim(sim), dd(), xres(XRES_), yres(YRES_) {
    sim.linkApp(this);
    keystatus = new char[256];
    std::memset(keystatus, 0, 256*sizeof(keystatus[0]));
}